

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue200_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Test::_Run(_Test_Test *this)

{
  long *plVar1;
  FilterPolicy *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  Status local_16d0;
  undefined1 local_16c8 [16];
  Slice local_16b8 [2];
  Tester local_1698;
  undefined1 local_14f8 [16];
  Slice local_14e8 [2];
  Tester local_14c8;
  undefined1 local_1328 [16];
  Slice local_1318 [2];
  Tester local_12f8;
  undefined1 local_1158 [16];
  Slice local_1148 [2];
  Tester local_1128;
  undefined1 local_f88 [16];
  Slice local_f78 [2];
  Tester local_f58;
  Slice local_db8;
  Slice local_da8;
  Slice local_d98;
  Status local_d88;
  Tester local_d80;
  long *local_be0;
  Iterator *iter;
  ReadOptions read_options;
  Slice local_bb8;
  Status local_ba8;
  Tester local_ba0;
  Slice local_a00;
  Slice local_9f0;
  Status local_9e0;
  Tester local_9d8;
  Slice local_838;
  Slice local_828;
  Status local_818;
  Tester local_810;
  Slice local_670;
  Slice local_660;
  Status local_650;
  Tester local_648;
  Slice local_4a8;
  Slice local_498;
  Status local_488;
  Tester local_480;
  WriteOptions local_2d9;
  WriteOptions write_options;
  Tester local_2d0;
  undefined1 local_130 [8];
  Options options;
  DB *db;
  Status local_68 [3];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string dbpath;
  _Test_Test *this_local;
  
  test::TmpDir_abi_cxx11_();
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::~string(local_50);
  Options::Options((Options *)&db);
  DestroyDB((leveldb *)local_68,local_30,(Options *)&db);
  Status::~Status(local_68);
  Options::Options((Options *)local_130);
  options.comparator._0_1_ = 1;
  test::Tester::Tester
            (&local_2d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x18);
  DB::Open((DB *)&stack0xfffffffffffffd28,(Options *)local_130,local_30,
           (DB **)&options.filter_policy);
  test::Tester::IsOk(&local_2d0,(Status *)&stack0xfffffffffffffd28);
  Status::~Status((Status *)&stack0xfffffffffffffd28);
  test::Tester::~Tester(&local_2d0);
  WriteOptions::WriteOptions(&local_2d9);
  test::Tester::Tester
            (&local_480,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1b);
  pFVar2 = options.filter_policy;
  Slice::Slice(&local_498,"1");
  Slice::Slice(&local_4a8,"b");
  (*pFVar2->_vptr_FilterPolicy[2])(&local_488,pFVar2,&local_2d9,&local_498,&local_4a8);
  test::Tester::IsOk(&local_480,&local_488);
  Status::~Status(&local_488);
  test::Tester::~Tester(&local_480);
  test::Tester::Tester
            (&local_648,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1c);
  pFVar2 = options.filter_policy;
  Slice::Slice(&local_660,"2");
  Slice::Slice(&local_670,"c");
  (*pFVar2->_vptr_FilterPolicy[2])(&local_650,pFVar2,&local_2d9,&local_660,&local_670);
  test::Tester::IsOk(&local_648,&local_650);
  Status::~Status(&local_650);
  test::Tester::~Tester(&local_648);
  test::Tester::Tester
            (&local_810,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1d);
  pFVar2 = options.filter_policy;
  Slice::Slice(&local_828,"3");
  Slice::Slice(&local_838,"d");
  (*pFVar2->_vptr_FilterPolicy[2])(&local_818,pFVar2,&local_2d9,&local_828,&local_838);
  test::Tester::IsOk(&local_810,&local_818);
  Status::~Status(&local_818);
  test::Tester::~Tester(&local_810);
  test::Tester::Tester
            (&local_9d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1e);
  pFVar2 = options.filter_policy;
  Slice::Slice(&local_9f0,"4");
  Slice::Slice(&local_a00,"e");
  (*pFVar2->_vptr_FilterPolicy[2])(&local_9e0,pFVar2,&local_2d9,&local_9f0,&local_a00);
  test::Tester::IsOk(&local_9d8,&local_9e0);
  Status::~Status(&local_9e0);
  test::Tester::~Tester(&local_9d8);
  test::Tester::Tester
            (&local_ba0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1f);
  pFVar2 = options.filter_policy;
  Slice::Slice(&local_bb8,"5");
  Slice::Slice((Slice *)&read_options.snapshot,"f");
  (*pFVar2->_vptr_FilterPolicy[2])(&local_ba8,pFVar2,&local_2d9,&local_bb8,&read_options.snapshot);
  test::Tester::IsOk(&local_ba0,&local_ba8);
  Status::~Status(&local_ba8);
  test::Tester::~Tester(&local_ba0);
  ReadOptions::ReadOptions((ReadOptions *)&iter);
  iVar3 = (*(options.filter_policy)->_vptr_FilterPolicy[6])
                    (options.filter_policy,(ReadOptions *)&iter);
  local_be0 = (long *)CONCAT44(extraout_var,iVar3);
  test::Tester::Tester
            (&local_d80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x25);
  pFVar2 = options.filter_policy;
  Slice::Slice(&local_d98,"25");
  Slice::Slice(&local_da8,"cd");
  (*pFVar2->_vptr_FilterPolicy[2])(&local_d88,pFVar2,&local_2d9,&local_d98,&local_da8);
  test::Tester::IsOk(&local_d80,&local_d88);
  Status::~Status(&local_d88);
  test::Tester::~Tester(&local_d80);
  plVar1 = local_be0;
  Slice::Slice(&local_db8,"5");
  (**(code **)(*plVar1 + 0x28))(plVar1,&local_db8);
  test::Tester::Tester
            (&local_f58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x28);
  local_f88 = (**(code **)(*local_be0 + 0x40))();
  Slice::ToString_abi_cxx11_(local_f78);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            (&local_f58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f78,
             (char (*) [2])0x1471b6);
  std::__cxx11::string::~string((string *)local_f78);
  test::Tester::~Tester(&local_f58);
  (**(code **)(*local_be0 + 0x38))();
  test::Tester::Tester
            (&local_1128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x2a);
  local_1158 = (**(code **)(*local_be0 + 0x40))();
  Slice::ToString_abi_cxx11_(local_1148);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            (&local_1128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1148,
             (char (*) [2])"4");
  std::__cxx11::string::~string((string *)local_1148);
  test::Tester::~Tester(&local_1128);
  (**(code **)(*local_be0 + 0x38))();
  test::Tester::Tester
            (&local_12f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x2c);
  local_1328 = (**(code **)(*local_be0 + 0x40))();
  Slice::ToString_abi_cxx11_(local_1318);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            (&local_12f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1318,
             (char (*) [2])"3");
  std::__cxx11::string::~string((string *)local_1318);
  test::Tester::~Tester(&local_12f8);
  (**(code **)(*local_be0 + 0x30))();
  test::Tester::Tester
            (&local_14c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x2e);
  local_14f8 = (**(code **)(*local_be0 + 0x40))();
  Slice::ToString_abi_cxx11_(local_14e8);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            (&local_14c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14e8,
             (char (*) [2])"4");
  std::__cxx11::string::~string((string *)local_14e8);
  test::Tester::~Tester(&local_14c8);
  (**(code **)(*local_be0 + 0x30))();
  test::Tester::Tester
            (&local_1698,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x30);
  local_16c8 = (**(code **)(*local_be0 + 0x40))();
  Slice::ToString_abi_cxx11_(local_16b8);
  test::Tester::IsEq<std::__cxx11::string,char[2]>
            (&local_1698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16b8,
             (char (*) [2])0x1471b6);
  std::__cxx11::string::~string((string *)local_16b8);
  test::Tester::~Tester(&local_1698);
  if (local_be0 != (long *)0x0) {
    (**(code **)(*local_be0 + 8))();
  }
  if (options.filter_policy != (FilterPolicy *)0x0) {
    (*(options.filter_policy)->_vptr_FilterPolicy[1])();
  }
  DestroyDB((leveldb *)&local_16d0,local_30,(Options *)local_130);
  Status::~Status(&local_16d0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Issue200, Test) {
  // Get rid of any state from an old run.
  std::string dbpath = test::TmpDir() + "/leveldb_issue200_test";
  DestroyDB(dbpath, Options());

  DB* db;
  Options options;
  options.create_if_missing = true;
  ASSERT_OK(DB::Open(options, dbpath, &db));

  WriteOptions write_options;
  ASSERT_OK(db->Put(write_options, "1", "b"));
  ASSERT_OK(db->Put(write_options, "2", "c"));
  ASSERT_OK(db->Put(write_options, "3", "d"));
  ASSERT_OK(db->Put(write_options, "4", "e"));
  ASSERT_OK(db->Put(write_options, "5", "f"));

  ReadOptions read_options;
  Iterator* iter = db->NewIterator(read_options);

  // Add an element that should not be reflected in the iterator.
  ASSERT_OK(db->Put(write_options, "25", "cd"));

  iter->Seek("5");
  ASSERT_EQ(iter->key().ToString(), "5");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "3");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "5");

  delete iter;
  delete db;
  DestroyDB(dbpath, options);
}